

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

void Abc_NtkDeleteObj_rec(Abc_Obj_t *pObj,int fOnlyNodes)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Vec_Ptr_t *vNodes;
  int fOnlyNodes_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x11a,"void Abc_NtkDeleteObj_rec(Abc_Obj_t *, int)");
  }
  iVar1 = Abc_ObjIsPi(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjFanoutNum(pObj);
    if (iVar1 == 0) {
      vNodes_00 = Vec_PtrAlloc(100);
      Abc_NodeCollectFanins(pObj,vNodes_00);
      Abc_NtkDeleteObj(pObj);
      if (fOnlyNodes == 0) {
        for (local_24 = 0; iVar1 = Vec_PtrSize(vNodes_00), local_24 < iVar1; local_24 = local_24 + 1
            ) {
          pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,local_24);
          iVar1 = Abc_ObjIsPi(pAVar2);
          if ((iVar1 == 0) && (iVar1 = Abc_ObjFanoutNum(pAVar2), iVar1 == 0)) {
            Abc_NtkDeleteObj_rec(pAVar2,0);
          }
        }
      }
      else {
        for (local_24 = 0; iVar1 = Vec_PtrSize(vNodes_00), local_24 < iVar1; local_24 = local_24 + 1
            ) {
          pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,local_24);
          iVar1 = Abc_ObjIsNode(pAVar2);
          if ((iVar1 != 0) && (iVar1 = Abc_ObjFanoutNum(pAVar2), iVar1 == 0)) {
            Abc_NtkDeleteObj_rec(pAVar2,fOnlyNodes);
          }
        }
      }
      Vec_PtrFree(vNodes_00);
      return;
    }
    __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x11c,"void Abc_NtkDeleteObj_rec(Abc_Obj_t *, int)");
  }
  __assert_fail("!Abc_ObjIsPi(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                ,0x11b,"void Abc_NtkDeleteObj_rec(Abc_Obj_t *, int)");
}

Assistant:

void Abc_NtkDeleteObj_rec( Abc_Obj_t * pObj, int fOnlyNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsPi(pObj) );
    assert( Abc_ObjFanoutNum(pObj) == 0 );
    // delete fanins and fanouts
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NodeCollectFanins( pObj, vNodes );
    Abc_NtkDeleteObj( pObj );
    if ( fOnlyNodes )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            if ( Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) == 0 )
                Abc_NtkDeleteObj_rec( pObj, fOnlyNodes );
    }
    else
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            if ( !Abc_ObjIsPi(pObj) && Abc_ObjFanoutNum(pObj) == 0 )
                Abc_NtkDeleteObj_rec( pObj, fOnlyNodes );
    }
    Vec_PtrFree( vNodes );
}